

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastUR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ulong *puVar3;
  SerialArena *this;
  __int_type_conflict _Var4;
  __pointer_type pSVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  Rep *pRVar9;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar10;
  string *s;
  ushort *puVar11;
  char *pcVar12;
  string *psVar13;
  uint uVar14;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  ulong uVar15;
  ulong uVar16;
  uint *puVar17;
  TcParseTableBase *ptr_00;
  pair<const_char_*,_int> pVar18;
  LogMessageFatal local_40 [16];
  
  if (data.field_0._0_1_ != '\0') {
    pcVar12 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar12;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  bVar1 = *ptr;
  uVar7 = CONCAT31(0,bVar1);
  puVar3 = (ulong *)this_00[2].data;
  if (puVar3 != (ulong *)0x0) {
    lVar8 = __tls_get_addr(&PTR_001b3f20);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(lVar8 + 8))->data;
    if (data.field_0.data == (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar3) {
      this = *(SerialArena **)(lVar8 + 0x10);
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
      if (((ulong)data.field_0 & 1) == 0) {
        uVar14 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
      }
      else {
        pRVar9 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
        uVar14 = pRVar9->allocated_size;
      }
      if (uVar14 == *(uint *)(this_00 + 1)) {
        do {
          bVar2 = *(byte *)((long)ptr + 1);
          ptr_00 = (TcParseTableBase *)(ulong)bVar2;
          uVar14 = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            pVar18 = ReadSizeFallback((char *)((long)ptr + 1),(uint)bVar2);
            ctx_00 = pVar18._8_8_;
            if ((TcParseTableBase *)pVar18.first == (TcParseTableBase *)0x0) goto LAB_00154baa;
            uVar14 = pVar18.second;
            ptr_00 = (TcParseTableBase *)pVar18.first;
          }
          else {
            ptr_00 = (TcParseTableBase *)((long)ptr + 2);
          }
          _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
          if (_Var4 == 0) {
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           SerialArena::AllocateFromStringBlockFallback(this);
          }
          else {
            uVar16 = _Var4 - 0x20;
            (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar16;
            pSVar5 = (this->string_block_)._M_b._M_p;
            uVar15 = (ulong)pSVar5->allocated_size_ - 0x10;
            if (uVar15 < uVar16) {
              psVar13 = absl::lts_20240722::log_internal::
                        MakeCheckOpString<unsigned_long,unsigned_long>
                                  (uVar16,uVar15,"offset <= effective_size()");
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        (local_40,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/string_block.h"
                         ,0xa2,*(undefined8 *)(psVar13 + 8),*(undefined8 *)psVar13);
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
            }
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           ((long)&pSVar5[-1].next_ + _Var4);
          }
          *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
          *(undefined8 *)((long)data.field_0 + 8) = 0;
          *(undefined1 *)((long)data.field_0 + 0x10) = 0;
          RepeatedPtrFieldBase::AddAllocatedForParse
                    ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
          ptr = EpsCopyInputStream::ReadString
                          (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar14,
                           (string *)data.field_0);
          ctx_00 = extraout_RDX;
          if ((ushort *)ptr == (ushort *)0x0) goto LAB_00154baa;
          pVVar10 = RepeatedPtrFieldBase::
                    Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                              ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
          cVar6 = utf8_range::IsStructurallyValid
                            (pVVar10->_M_string_length,(pVVar10->_M_dataplus)._M_p);
          if (cVar6 == '\0') goto LAB_00154b9c;
          puVar11 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
          if (puVar11 <= ptr) goto LAB_00154b64;
          data.field_0.data._4_4_ = 0;
          data.field_0.data._0_4_ = uVar7;
        } while ((byte)*(ushort *)ptr == bVar1);
        goto LAB_00154b1a;
      }
    }
  }
  do {
    ptr_00 = (TcParseTableBase *)((long)ptr + 1);
    s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
    ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
    ctx_00 = extraout_RDX_00;
    if ((ushort *)ptr == (ushort *)0x0) goto LAB_00154baa;
    pVVar10 = RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
    cVar6 = utf8_range::IsStructurallyValid(pVVar10->_M_string_length,(pVVar10->_M_dataplus)._M_p);
    if (cVar6 == '\0') goto LAB_00154b9c;
    puVar11 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (puVar11 <= ptr) goto LAB_00154b64;
    data.field_0.data._4_4_ = 0;
    data.field_0.data._0_4_ = uVar7;
  } while ((byte)*(ushort *)ptr == bVar1);
LAB_00154b1a:
  if (ptr < puVar11) {
    uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar7 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar15 = (ulong)(uVar7 & 0xfffffff8);
    pcVar12 = (char *)(**(code **)(&table[1].has_bits_offset + uVar15))
                                (msg,ptr,ctx,
                                 (ulong)*(ushort *)ptr ^
                                 *(ulong *)(&table[1].fast_idx_mask + uVar15 * 2),table,hasbits);
    return pcVar12;
  }
LAB_00154b64:
  if ((ulong)table->has_bits_offset != 0) {
    puVar17 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar17 & 3) != 0) {
      AlignFail();
    }
    *puVar17 = *puVar17 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
LAB_00154b9c:
  ptr_00 = table;
  ReportFastUtf8Error(uVar7,table);
  ctx_00 = extraout_RDX_01;
LAB_00154baa:
  pcVar12 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
  return pcVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<uint8_t,
                                          RepeatedPtrField<std::string>, kUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}